

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EnsureNoRedeclarations
          (ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock,FuncInfo *funcInfo)

{
  Scope *pSVar1;
  code *pcVar2;
  bool bVar3;
  SymbolType SVar4;
  ScopeType SVar5;
  undefined4 *puVar6;
  ParseNodeFnc *pPVar7;
  ParseNodeBlock *pPVar8;
  ParseNodeCatch *pPVar9;
  ParseNodeWith *pPVar10;
  ParseNodeVar *pPVar11;
  Scope *pSVar12;
  CharacterBuffer<char16_t> *key;
  Symbol *local_48;
  Symbol *sym;
  ParseNode *pnode_1;
  ParseNodePtr pnode;
  anon_class_8_1_8991fb9c emitRedeclCheck;
  FuncInfo *funcInfo_local;
  ParseNodeBlock *pnodeBlock_local;
  ByteCodeGenerator *this_local;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1661,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((pnodeBlock->field_0x5c & 3) != 0) &&
     (SVar5 = Scope::GetScopeType(pnodeBlock->scope), SVar5 != ScopeType_GlobalEvalBlock)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1662,
                       "(pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                       ,
                       "pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((this->flags & 0x800) == 0) {
    emitRedeclCheck.this = this;
    IterateBlockScopedVariables<ByteCodeGenerator::EnsureNoRedeclarations(ParseNodeBlock*,FuncInfo*)::__0>
              (this,pnodeBlock,(anon_class_8_1_8991fb9c)this);
  }
  pnode_1 = pnodeBlock->pnodeScopes;
  pnode = (ParseNodePtr)this;
  do {
    if (pnode_1 == (ParseNode *)0x0) {
      sym = (Symbol *)funcInfo->root->pnodeVars;
      do {
        if (sym == (Symbol *)0x0) {
          return;
        }
        pPVar11 = ParseNode::AsParseNodeVar((ParseNode *)sym);
        local_48 = pPVar11->sym;
        if (((local_48 != (Symbol *)0x0) &&
            (pPVar11 = ParseNode::AsParseNodeVar((ParseNode *)sym),
            pPVar11->isBlockScopeFncDeclVar == '\0')) &&
           (bVar3 = Symbol::IsSpecialSymbol(local_48), !bVar3)) {
          bVar3 = Symbol::GetIsCatch(local_48);
          if ((bVar3) ||
             ((*(char *)&(sym->name).string.ptr == 'Q' &&
              (bVar3 = Symbol::GetIsBlockVar(local_48), bVar3)))) {
            bVar3 = Symbol::GetIsCatch(local_48);
            if ((!bVar3) &&
               (pSVar1 = funcInfo->bodyScope, pSVar12 = Symbol::GetScope(local_48),
               pSVar1 == pSVar12)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x16bc,
                                 "(sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope())",
                                 "sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope()");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            pSVar1 = funcInfo->bodyScope;
            key = Symbol::GetName(local_48);
            local_48 = Scope::FindLocalSymbol(pSVar1,key);
            if (((local_48 == (Symbol *)0x0) || (bVar3 = Symbol::GetIsCatch(local_48), bVar3)) ||
               (bVar3 = Symbol::GetIsBlockVar(local_48), bVar3)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x16be,"(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())",
                                 "sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
          }
          bVar3 = Symbol::GetIsGlobal(local_48);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x16c1,"(sym->GetIsGlobal())","sym->GetIsGlobal()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          SVar4 = Symbol::GetSymbolType(local_48);
          if (SVar4 == STVariable) {
            EnsureNoRedeclarations::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&pnode,local_48,funcInfo,false);
          }
        }
        pPVar11 = ParseNode::AsParseNodeVar((ParseNode *)sym);
        sym = (Symbol *)pPVar11->pnodeNext;
      } while( true );
    }
    switch(pnode_1->nop) {
    case knopFncDecl:
      pPVar7 = ParseNode::AsParseNodeFnc(pnode_1);
      bVar3 = ParseNodeFnc::IsDeclaration(pPVar7);
      if (bVar3) {
        pPVar7 = ParseNode::AsParseNodeFnc(pnode_1);
        EnsureNoRedeclarations::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)&pnode,pPVar7->pnodeName->sym,funcInfo,true);
      }
      pPVar7 = ParseNode::AsParseNodeFnc(pnode_1);
      pnode_1 = pPVar7->pnodeNext;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x16a8,"((0))","UNREACHED");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      break;
    case knopBlock:
      pPVar8 = ParseNode::AsParseNodeBlock(pnode_1);
      pnode_1 = pPVar8->pnodeNext;
      break;
    case knopWith:
      pPVar10 = ParseNode::AsParseNodeWith(pnode_1);
      pnode_1 = pPVar10->pnodeNext;
      break;
    case knopCatch:
      pPVar9 = ParseNode::AsParseNodeCatch(pnode_1);
      pnode_1 = pPVar9->pnodeNext;
    }
  } while( true );
}

Assistant:

void ByteCodeGenerator::EnsureNoRedeclarations(ParseNodeBlock *pnodeBlock, FuncInfo *funcInfo)
{
    // Emit dynamic runtime checks for variable re-declarations. Only necessary for global functions (script or eval).
    // In eval only var declarations can cause redeclaration, and only in non-strict mode, because let/const variables
    // remain local to the eval code.

    Assert(pnodeBlock->nop == knopBlock);
    Assert(pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock);

    if (!(this->flags & fscrEvalCode))
    {
        IterateBlockScopedVariables(pnodeBlock, [this](ParseNode *pnode)
        {
            FuncInfo *funcInfo = this->TopFuncInfo();
            Symbol *sym = pnode->AsParseNodeVar()->sym;

            Assert(sym->GetIsGlobal());

            Js::PropertyId propertyId = sym->EnsurePosition(this);

            this->m_writer.ElementRootU(Js::OpCode::EnsureNoRootFld, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        });
    }

    auto emitRedeclCheck = [this](Symbol * sym, FuncInfo * funcInfo, bool isFncDecl = false)
    {
        Js::PropertyId propertyId = sym->EnsurePosition(this);

        // Global function declarations must pass #sec-candeclareglobalfunction
        // which is enforced by EnsureCanDeclGloFunc
        if (isFncDecl)
        {
            this->m_writer.ElementRootU(Js::OpCode::EnsureCanDeclGloFunc, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }

        if (this->flags & fscrEval)
        {
            if (!funcInfo->byteCodeFunction->GetIsStrictMode())
            {
                this->m_writer.ScopedProperty(Js::OpCode::ScopedEnsureNoRedeclFld, ByteCodeGenerator::RootObjectRegister,
                    funcInfo->FindOrAddReferencedPropertyId(propertyId));
            }
        }
        else
        {
            this->m_writer.ElementRootU(Js::OpCode::EnsureNoRootRedeclFld, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }
    };

    // scan for function declarations
    // these behave like "var" declarations
    for (ParseNodePtr pnode = pnodeBlock->pnodeScopes; pnode;)
    {
        switch (pnode->nop) {

        case knopFncDecl:
            if (pnode->AsParseNodeFnc()->IsDeclaration())
            {
                emitRedeclCheck(pnode->AsParseNodeFnc()->pnodeName->sym, funcInfo, true);
            }

            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;

        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;

        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;

        default:
            Assert(UNREACHED);
        }
    }

    // scan for var declarations
    for (ParseNode *pnode = funcInfo->root->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
    {
        Symbol* sym = pnode->AsParseNodeVar()->sym;

        if (sym == nullptr || pnode->AsParseNodeVar()->isBlockScopeFncDeclVar || sym->IsSpecialSymbol())
            continue;

        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
        {
            // The init node was bound to the catch object, because it's inside a catch and has the
            // same name as the catch object. But we want to define a user var at function scope,
            // so find the right symbol. (We'll still assign the RHS value to the catch object symbol.)
            // This also applies to a var declaration in the same scope as a let declaration.

            // Assert that catch cannot be at function scope and let and var at function scope is redeclaration error.
            Assert(sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope());
            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
            Assert(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar());
        }

        Assert(sym->GetIsGlobal());

        if (sym->GetSymbolType() == STVariable)
        {
            emitRedeclCheck(sym, funcInfo);
        }
    }
}